

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardSubsumptionDemodulation.cpp
# Opt level: O0

void __thiscall
Inferences::BackwardSubsumptionDemodulation::performWithQueryLit
          (BackwardSubsumptionDemodulation *this,Clause *sideCl,Literal *candidateQueryLit,
          vector<Inferences::BwSimplificationRecord,_std::allocator<Inferences::BwSimplificationRecord>_>
          *simplifications)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Literal **ppLVar4;
  Literal *in_RDX;
  Clause *in_RSI;
  long in_RDI;
  uint pred_1;
  Literal *lit;
  uint ii;
  bool haveMustPred;
  uint pred;
  Literal *blit;
  uint bi;
  uint numPosEqs;
  uint positiveEqualityHeader;
  Clause *candidate;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> qr;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  rit;
  uint mustPred;
  bool mustPredActive;
  bool mustPredInit;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
  *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  undefined2 uVar5;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  uint local_84;
  uint local_70;
  uint local_6c;
  SaturationAlgorithm *this_00;
  Clause *in_stack_ffffffffffffffa8;
  Clause *in_stack_ffffffffffffffb0;
  BackwardSubsumptionDemodulation *in_stack_ffffffffffffffb8;
  uint local_28;
  bool local_22;
  
  uVar5 = (undefined2)((ulong)in_stack_ffffffffffffff18 >> 0x30);
  Indexing::RequestedIndex<Indexing::BackwardSubsumptionIndex>::operator->
            ((RequestedIndex<Indexing::BackwardSubsumptionIndex> *)(in_RDI + 0x10));
  Indexing::LiteralIndex<Indexing::LiteralClause>::getInstances
            ((LiteralIndex<Indexing::LiteralClause> *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,
                               CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))),
             (Literal *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
  do {
    bVar1 = Lib::
            VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
            ::hasNext((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                       *)0x76f238);
    if (!bVar1) {
      Lib::
      VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
      ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
                          *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      return;
    }
    Lib::
    VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>_>
    ::next(in_stack_ffffffffffffff08);
    this_00 = (in_stack_ffffffffffffffb8->super_BackwardSimplificationEngine).super_InferenceEngine.
              _salg;
    uVar2 = Kernel::Clause::length(in_RSI);
    uVar3 = Kernel::Clause::length((Clause *)this_00);
    if ((uVar2 <= uVar3) && (bVar1 = Kernel::Clause::hasAux((Clause *)this_00), !bVar1)) {
      Kernel::Clause::setAux((Clause *)this_00,(void *)0x0);
      Kernel::Clause::color((Clause *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))
      ;
      Kernel::Clause::color((Clause *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))
      ;
      bVar1 = Kernel::ColorHelper::compatible(COLOR_TRANSPARENT,0x76f36a);
      if (bVar1) {
        local_6c = 0;
        local_28 = 0;
        for (local_70 = 0; uVar2 = Kernel::Clause::length(in_RSI), local_70 < uVar2;
            local_70 = local_70 + 1) {
          ppLVar4 = Kernel::Clause::operator[](in_RSI,local_70);
          if (*ppLVar4 != in_RDX) {
            bVar1 = Kernel::Literal::isPositive((Literal *)0x76f441);
            if ((bVar1) && (bVar1 = Kernel::Literal::isEquality((Literal *)0x76f45e), bVar1)) {
              local_6c = local_6c + 1;
            }
            uVar2 = Kernel::Literal::header
                              ((Literal *)
                               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
            if (local_28 < uVar2) {
              local_28 = uVar2;
            }
          }
        }
        local_22 = local_28 != 1 || 1 < local_6c;
        if (local_22) {
          bVar1 = false;
          local_84 = 0;
          while (uVar2 = local_84, uVar3 = Kernel::Clause::length((Clause *)this_00), uVar2 < uVar3)
          {
            ppLVar4 = Kernel::Clause::operator[]((Clause *)this_00,local_84);
            if ((*ppLVar4 !=
                 (Literal *)
                 (in_stack_ffffffffffffffb8->super_BackwardSimplificationEngine).
                 super_InferenceEngine._vptr_InferenceEngine) &&
               (in_stack_ffffffffffffff14 =
                     Kernel::Literal::header
                               ((Literal *)
                                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
               in_stack_ffffffffffffff14 == local_28)) {
              bVar1 = true;
              break;
            }
            local_84 = local_84 + 1;
          }
          if (!bVar1) goto LAB_0076f5f2;
        }
        simplifyCandidate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                          in_stack_ffffffffffffffa8,
                          (vector<Inferences::BwSimplificationRecord,_std::allocator<Inferences::BwSimplificationRecord>_>
                           *)this_00);
      }
    }
LAB_0076f5f2:
    Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause>::
    ~QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> *)
              0x76f5ff);
  } while( true );
}

Assistant:

void BackwardSubsumptionDemodulation::performWithQueryLit(Clause* sideCl, Literal* candidateQueryLit, std::vector<BwSimplificationRecord>& simplifications)
{
  //   sideCl
  // vvvvvvvvvv
  //
  // l = r \/ C      CΘ \/ L[lΘ] \/ D
  // --------------------------------
  //       CΘ \/ L[rΘ] \/ D

#if VDEBUG
  // make sure DuplicateLiteralRemovalISE has been run on this
  DHSet<Literal*> lits;
  for (unsigned i = 0; i < sideCl->length(); ++i) {
    ALWAYS(lits.insert((*sideCl)[i]));
  }
#endif

  bool mustPredInit = false;
  bool mustPredActive = false;
  unsigned mustPred;

  auto rit = _index->getInstances(candidateQueryLit, false, false);
  while (rit.hasNext()) {
    auto qr = rit.next();
    Clause* candidate = qr.data->clause;

    // not enough literals to fit match and rewritten literal (performance)
    if (sideCl->length() > candidate->length()) {
      continue;
    }

    // this is impossible
    // (if it triggers, then skip the candidate. SD with twice the same clause is impossible. even if it were, FSD should have dealt with it.)
    ASS_NEQ(sideCl, candidate);

    if (candidate->hasAux()) {
      continue;  // we've already checked this premise
    }
    candidate->setAux(nullptr);

    if (!ColorHelper::compatible(sideCl->color(), candidate->color())) {
      continue;
    }

    RSTAT_CTR_INC("bsd 0 candidates");

    // Here we pick one literal header of the base clause and make sure that
    // every instance clause has it
    //
    // Possibilities to consider:
    // 1. Choose one that is not a positive equality, the other clause must contain it.
    // 2. Choose two positive equalities, the other clause must contain at least one of them. (but those are indistinguishable by literal header)
    // 3. If it's a two-literal clause where the only thing left here is the positive equality, we cannot (and should not) exclude anything with this check.
    //
    // Case A: candidateQueryLit is not a positive equality.
    // - there is at least one positive equality in the remaining literals
    // - we need to skip one positive equality for the "mustPred" check.
    // Case B: candidateQueryLit is a positive equality.
    // - in this case, there is another positive equality in sideCl due to selection of the candidateQueryLit.
    // - Case B.1: BSD where candidateQueryLit is the rewriting equality:
    //             => any of the others can be chosen as mustPred
    //             (this case doesn't really matter since it will be found by the other call to this function; with the other candidateQueryLit.)
    //   Case B.2: BSD where candidateQueryLit is not the rewriting equality:
    //             => we must skip one positive equality for the "mustPred" check
    //
    // Summary: must skip one positive equality in the remaining literals for this "mustPred" check.
    if (!mustPredInit) {
      unsigned const positiveEqualityHeader = 1;
#if VDEBUG
      // To verify the hard-coded value of positiveEqualityHeader
      Literal* posEq = Literal::createEquality(true, TermList(0, false), TermList(1, false), AtomicSort::defaultSort());
      ASS_EQ(posEq->header(), positiveEqualityHeader);
#endif
      unsigned numPosEqs = 0;
      //since the base clause has at least two children, this will always
      //contain an existing literal header after the loop
      mustPred = 0;  // header value 0 means positive equality
      for (unsigned bi = 0; bi < sideCl->length(); ++bi) {
        Literal* blit = (*sideCl)[bi];
        if (blit == candidateQueryLit) {
          continue;
        }
        // only count in the other literals (see case B.2)
        if (blit->isPositive() && blit->isEquality()) {
          ++numPosEqs;
        }
        unsigned pred = blit->header();
        if (pred > mustPred) {
          mustPred = pred;
        }
      }
      if (mustPred == positiveEqualityHeader) {
        // for positive equality we need to have skipped at least in the remaining literals
        mustPredActive = (numPosEqs >= 2);
      } else {
        mustPredActive = true;
      }
    }
    if (mustPredActive) {
      bool haveMustPred = false;
      for (unsigned ii = 0; ii < candidate->length(); ++ii) {
        Literal* lit = (*candidate)[ii];
        if (lit == qr.data->literal) {
          continue;
        }
        unsigned pred = lit->header();
        if (pred == mustPred) {
          haveMustPred = true;
          break;
        }
      }
      if (!haveMustPred) {
        continue;
      }
    }
    RSTAT_CTR_INC("bsd 1 mustPred survivors");

    simplifyCandidate(sideCl, candidate, simplifications);
  }
}